

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi_load_from_file(FILE *f,int *x,int *y,int *comp,int req_comp)

{
  uchar *puVar1;
  undefined1 local_108 [8];
  stbi__context s;
  
  s.img_buffer_original._4_4_ = req_comp;
  stbi__start_callbacks((stbi__context *)local_108,&stbi__stdio_callbacks,f);
  puVar1 = stbi__load_flip((stbi__context *)local_108,x,y,comp,s.img_buffer_original._4_4_);
  if (puVar1 != (uchar *)0x0) {
    fseek((FILE *)f,(long)(s.buffer_start._120_4_ - (int)s.img_buffer),1);
  }
  return puVar1;
}

Assistant:

STBIDEF stbi_uc *stbi_load_from_file(FILE *f, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *result;
   stbi__context s;
   stbi__start_file(&s,f);
   result = stbi__load_flip(&s,x,y,comp,req_comp);
   if (result) {
      // need to 'unget' all the characters in the IO buffer
      fseek(f, - (int) (s.img_buffer_end - s.img_buffer), SEEK_CUR);
   }
   return result;
}